

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

void __thiscall ipx::Model::ScaleModel(Model *this,Control *control)

{
  Vector *this_00;
  Vector *this_01;
  double dVar1;
  pointer piVar2;
  double *pdVar3;
  double *pdVar4;
  int local_3c;
  Control *local_38;
  
  piVar2 = (this->flipped_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->flipped_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar2) {
    (this->flipped_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar2;
  }
  local_38 = control;
  for (local_3c = 0; local_3c < this->num_var_; local_3c = local_3c + 1) {
    pdVar3 = (this->scaled_ubuser_)._M_data;
    dVar1 = pdVar3[local_3c];
    if (((ulong)ABS(dVar1) < 0x7ff0000000000000) &&
       (pdVar4 = (this->scaled_lbuser_)._M_data, ABS(pdVar4[local_3c]) == INFINITY)) {
      pdVar4[local_3c] = -dVar1;
      pdVar3[local_3c] = INFINITY;
      ScaleColumn(&this->A_,local_3c,-1.0);
      pdVar3 = (this->scaled_obj_)._M_data;
      pdVar3[local_3c] = (double)((ulong)pdVar3[local_3c] ^ (ulong)DAT_003990d0);
      std::vector<int,_std::allocator<int>_>::push_back(&this->flipped_vars_,&local_3c);
    }
  }
  this_00 = &this->colscale_;
  std::valarray<double>::resize(this_00,0,0.0);
  this_01 = &this->rowscale_;
  std::valarray<double>::resize(this_01,0,0.0);
  if (0 < (local_38->parameters_).super_ipx_parameters.scale) {
    EquilibrateMatrix(this);
  }
  if (this_00->_M_size != 0) {
    std::valarray<double>::operator*=(&this->scaled_obj_,this_00);
    std::valarray<double>::operator/=(&this->scaled_lbuser_,this_00);
    std::valarray<double>::operator/=(&this->scaled_ubuser_,this_00);
  }
  if (this_01->_M_size != 0) {
    std::valarray<double>::operator*=(&this->scaled_rhs_,this_01);
  }
  return;
}

Assistant:

void Model::ScaleModel(const Control& control) {
    flipped_vars_.clear();
    for (Int j = 0; j < num_var_; j++) {
        if (std::isfinite(scaled_ubuser_[j]) && std::isinf(scaled_lbuser_[j])) {
            scaled_lbuser_[j] = -scaled_ubuser_[j];
            scaled_ubuser_[j] = INFINITY;
            ScaleColumn(A_, j, -1.0);
            scaled_obj_[j] *= -1.0;
            flipped_vars_.push_back(j);
        }
    }
    colscale_.resize(0);
    rowscale_.resize(0);

    // Choose scaling method.
    if (control.scale() >= 1)
        EquilibrateMatrix();

    // Apply scaling to vectors.
    if (colscale_.size() > 0) {
        assert((Int)colscale_.size() == num_var_);
        scaled_obj_ *= colscale_;
        scaled_lbuser_ /= colscale_;
        scaled_ubuser_ /= colscale_;
    }
    if (rowscale_.size() > 0) {
        assert((Int)rowscale_.size() == num_constr_);
        scaled_rhs_ *= rowscale_;
    }
}